

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O1

PaError Pa_ReadStream(PaStream *stream,void *buffer,unsigned_long frames)

{
  int iVar1;
  int iVar2;
  PaError PVar3;
  
  if (initializationCount_ == 0) {
    iVar1 = -10000;
  }
  else if (stream == (PaStream *)0x0) {
    iVar1 = -0x2704;
  }
  else {
    iVar1 = -0x2704;
    if (*stream == 0x18273645) {
      iVar1 = 0;
    }
  }
  if (iVar1 == 0) {
    if (frames == 0) {
      iVar1 = 0;
    }
    else if (buffer == (void *)0x0) {
      iVar1 = -0x26f4;
    }
    else {
      iVar2 = (**(code **)(*(long *)((long)stream + 0x10) + 0x20))(stream);
      if (iVar2 == 0) {
        PVar3 = (**(code **)(*(long *)((long)stream + 0x10) + 0x40))(stream,buffer,frames);
        return PVar3;
      }
      iVar1 = -0x26ff;
      if (iVar2 != 1) {
        iVar1 = iVar2;
      }
    }
  }
  return iVar1;
}

Assistant:

PaError Pa_ReadStream( PaStream* stream,
                       void *buffer,
                       unsigned long frames )
{
    PaError result = PaUtil_ValidateStreamPointer( stream );

    PA_LOGAPI_ENTER_PARAMS( "Pa_ReadStream" );
    PA_LOGAPI(("\tPaStream* stream: 0x%p\n", stream ));

    if( result == paNoError )
    {
        if( frames == 0 )
        {
            /* @todo Should we not allow the implementation to signal any overflow condition? see: http://www.portaudio.com/trac/ticket/116*/
            result = paNoError;
        }
        else if( buffer == 0 )
        {
            result = paBadBufferPtr;
        }
        else
        {
            result = PA_STREAM_INTERFACE(stream)->IsStopped( stream );
            if( result == 0 )
            {
                result = PA_STREAM_INTERFACE(stream)->Read( stream, buffer, frames );
            }
            else if( result == 1 )
            {
                result = paStreamIsStopped;
            }
        }
    }

    PA_LOGAPI_EXIT_PAERROR( "Pa_ReadStream", result );

    return result;
}